

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Type __thiscall wasm::TranslateToFuzzReader::getSingleConcreteType(TranslateToFuzzReader *this)

{
  Random *this_00;
  ulong uVar1;
  WeightedOption rest_1;
  WeightedOption rest_2;
  uint32_t uVar2;
  FeatureOptions<wasm::Type> *pFVar3;
  Type TVar4;
  value_type *pvVar5;
  ulong uVar6;
  WeightedOption weightedOption;
  WeightedOption weightedOption_00;
  WeightedOption rest;
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  local_78;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  
  if ((((byte)this->wasm[0x179] & 1) != 0) &&
     ((this->interestingHeapTypes).
      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->interestingHeapTypes).
      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    this_00 = &this->random;
    uVar2 = Random::upTo(this_00,3);
    if (uVar2 == 0) {
      pvVar5 = Random::pick<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>
                         (this_00,&this->interestingHeapTypes);
      uVar1 = pvVar5->id;
      if ((((byte)this->wasm[0x179] & 4) == 0) || (uVar2 = Random::upTo(this_00,2), uVar2 != 0)) {
        uVar6 = 2;
      }
      else {
        uVar6 = 0;
      }
      if (((uint)(0x7c < uVar1) * 4 + 3 & (uint)uVar1) == 0) {
        return (Type)(uVar6 | uVar1);
      }
      __assert_fail("!(heapType.getID() & (TupleMask | NullMask | (heapType.isBasic() ? 0 : ExactMask)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x14c,"wasm::Type::Type(HeapType, Nullability, Exactness)");
    }
  }
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = 4;
  uStack_38 = 4;
  local_30 = 5;
  uStack_28 = 4;
  rest_1.weight = 4;
  rest_1.option.id = 4;
  rest_2.weight = 4;
  rest_2.option.id = 5;
  weightedOption.weight = 4;
  weightedOption.option.id = 2;
  rest.weight = 4;
  rest.option.id = 3;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar3 = Random::FeatureOptions<wasm::Type>::
           add<wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption,wasm::Random::FeatureOptions<wasm::Type>::WeightedOption>
                     ((FeatureOptions<wasm::Type> *)&local_78,(FeatureSet)0x0,weightedOption,rest,
                      rest_1,rest_2);
  weightedOption_00.weight = 2;
  weightedOption_00.option.id = 6;
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(pFVar3,(FeatureSet)0x8,weightedOption_00);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                     (pFVar3,(FeatureSet)0x100,(Type)0x12,(Type)0xa);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<>(pFVar3,(FeatureSet)0x40,(Type)0x4a);
  pFVar3 = Random::FeatureOptions<wasm::Type>::
           add<wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type,wasm::Type>
                     (pFVar3,(FeatureSet)0x500,(Type)0x22,(Type)0x2a,(Type)0x28,(Type)0x32,
                      (Type)0x3a,(Type)0x38,(Type)0x42,(Type)0x40);
  pFVar3 = Random::FeatureOptions<wasm::Type>::add<wasm::Type>
                     (pFVar3,(FeatureSet)0x4000,(Type)0x52,(Type)0x50);
  TVar4 = Random::pick<wasm::Type>(&this->random,pFVar3);
  std::
  _Rb_tree<wasm::FeatureSet,_std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_std::_Select1st<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>,_std::less<wasm::FeatureSet>,_std::allocator<std::pair<const_wasm::FeatureSet,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>_>
  ::~_Rb_tree(&local_78);
  return (Type)TVar4.id;
}

Assistant:

Type TranslateToFuzzReader::getSingleConcreteType() {
  if (wasm.features.hasReferenceTypes() && !interestingHeapTypes.empty() &&
      oneIn(3)) {
    auto heapType = pick(interestingHeapTypes);
    auto nullability = getNullability();
    return Type(heapType, nullability);
  }
  // Skip (ref func|extern|i31|exn) because there is no way to create them in
  // globals. TODO
  using WeightedOption = FeatureOptions<Type>::WeightedOption;
  return pick(FeatureOptions<Type>()
                .add(FeatureSet::MVP,
                     WeightedOption{Type::i32, VeryImportant},
                     WeightedOption{Type::i64, VeryImportant},
                     WeightedOption{Type::f32, VeryImportant},
                     WeightedOption{Type::f64, VeryImportant})
                .add(FeatureSet::SIMD, WeightedOption{Type::v128, Important})
                .add(FeatureSet::ReferenceTypes,
                     Type(HeapType::func, Nullable),
                     Type(HeapType::ext, Nullable))
                .add(FeatureSet::ExceptionHandling,
                     // Type(HeapType::exn, NonNullable),
                     Type(HeapType::exn, Nullable))
                .add(FeatureSet::ReferenceTypes | FeatureSet::GC,
                     // Type(HeapType::func, NonNullable),
                     // Type(HeapType::ext, NonNullable),
                     Type(HeapType::any, Nullable),
                     // Type(HeapType::any, NonNullable),
                     Type(HeapType::eq, Nullable),
                     Type(HeapType::eq, NonNullable),
                     Type(HeapType::i31, Nullable),
                     // Type(HeapType::i31, NonNullable),
                     Type(HeapType::struct_, Nullable),
                     Type(HeapType::struct_, NonNullable),
                     Type(HeapType::array, Nullable),
                     Type(HeapType::array, NonNullable))
                .add(FeatureSet::Strings,
                     Type(HeapType::string, Nullable),
                     Type(HeapType::string, NonNullable)));
}